

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O2

Node * prvTidyFindDocType(TidyDocImpl *doc)

{
  Node *pNVar1;
  Node **ppNVar2;
  
  if (doc != (TidyDocImpl *)0x0) {
    ppNVar2 = &(doc->root).content;
    while( true ) {
      pNVar1 = *ppNVar2;
LAB_00146150:
      if ((pNVar1 == (Node *)0x0) || (pNVar1->type == DocTypeTag)) break;
      ppNVar2 = &pNVar1->next;
    }
    return pNVar1;
  }
  pNVar1 = (Node *)0x0;
  goto LAB_00146150;
}

Assistant:

Node *TY_(FindDocType)( TidyDocImpl* doc )
{
    Node* node;
    for ( node = (doc ? doc->root.content : NULL);
          node && node->type != DocTypeTag; 
          node = node->next )
        /**/;
    return node;
}